

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int __thiscall Bstrlib::String::reverseFind(String *this,char c,int pos)

{
  int local_20;
  int pos_local;
  char c_local;
  String *this_local;
  
  local_20 = pos;
  if (pos < 0) {
    local_20 = (this->super_tagbstring).slen + -1;
  }
  if (local_20 <= (this->super_tagbstring).slen) {
    if (local_20 == (this->super_tagbstring).slen) {
      local_20 = local_20 + -1;
    }
    for (; -1 < local_20; local_20 = local_20 + -1) {
      if ((this->super_tagbstring).data[local_20] == c) {
        return local_20;
      }
    }
  }
  return -1;
}

Assistant:

int String::reverseFind(char c, int pos) const
    {
        if (pos < 0) pos = slen-1;
        if (pos > slen)            return BSTR_ERR;
        if (pos == slen)        pos--;
        for (; pos >= 0; pos--)
        {
            if (data[pos] ==(unsigned char) c)    return pos;
        }
        return BSTR_ERR;
    }